

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_double_3_suite::test_ctor(void)

{
  value_type local_78;
  ulong local_70;
  moment<double,_3> filter;
  
  filter.member.window.super_span<double,_3UL>.member.data = (pointer)&filter;
  filter.member.window.super_span<double,_3UL>.member.size = 0;
  filter.member.window.super_span<double,_3UL>.member.next = 3;
  filter.member.mean = 0.0;
  local_78 = 1.48219693752374e-323;
  local_70 = CONCAT44(local_70._4_4_,3);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xac,"void mean_double_3_suite::test_ctor()",&local_78,&local_70);
  local_70._0_1_ = 1;
  local_78._0_1_ = filter.member.window.super_span<double,_3UL>.member.size == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xad,"void mean_double_3_suite::test_ctor()",&local_78,&local_70);
  local_78 = (value_type)
             CONCAT71(local_78._1_7_,filter.member.window.super_span<double,_3UL>.member.size == 3);
  local_70 = (ulong)local_70._1_7_ << 8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xae,"void mean_double_3_suite::test_ctor()",&local_78,&local_70);
  local_78 = (value_type)filter.member.window.super_span<double,_3UL>.member.size;
  local_70 = local_70 & 0xffffffff00000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xaf,"void mean_double_3_suite::test_ctor()",&local_78,&local_70);
  local_78 = filter.member.mean;
  local_70 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0xb0,"void mean_double_3_suite::test_ctor()",&local_78,&local_70);
  return;
}

Assistant:

void test_ctor()
{
    window::moment<double, 3> filter;
    TRIAL_TEST_EQ(filter.capacity(), 3);
    TRIAL_TEST_EQ(filter.empty(), true);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 0);
    TRIAL_TEST_EQ(filter.mean(), 0.0);
}